

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_DetachArrayBuffer(JSContext *ctx,JSValue obj)

{
  undefined4 *puVar1;
  long lVar2;
  JSTypedArray *ta;
  undefined4 *puVar3;
  
  if (((((int)obj.tag == -1) && (*(short *)((long)obj.u.ptr + 6) == 0x13)) &&
      (puVar1 = *(undefined4 **)((long)obj.u.ptr + 0x30), puVar1 != (undefined4 *)0x0)) &&
     (*(char *)(puVar1 + 1) == '\0')) {
    if (*(code **)(puVar1 + 10) != (code *)0x0) {
      (**(code **)(puVar1 + 10))(ctx->rt,*(undefined8 *)(puVar1 + 8),*(undefined8 *)(puVar1 + 2));
    }
    *(undefined8 *)(puVar1 + 2) = 0;
    *puVar1 = 0;
    *(undefined1 *)(puVar1 + 1) = 1;
    for (puVar3 = *(undefined4 **)(puVar1 + 6); puVar3 != puVar1 + 4;
        puVar3 = *(undefined4 **)(puVar3 + 2)) {
      lVar2 = *(long *)(puVar3 + 4);
      if (*(short *)(lVar2 + 6) != 0x1e) {
        *(undefined4 *)(lVar2 + 0x40) = 0;
        *(undefined8 *)(lVar2 + 0x38) = 0;
      }
    }
  }
  return;
}

Assistant:

void JS_DetachArrayBuffer(JSContext *ctx, JSValueConst obj)
{
    JSArrayBuffer *abuf = JS_GetOpaque(obj, JS_CLASS_ARRAY_BUFFER);
    struct list_head *el;

    if (!abuf || abuf->detached)
        return;
    if (abuf->free_func)
        abuf->free_func(ctx->rt, abuf->opaque, abuf->data);
    abuf->data = NULL;
    abuf->byte_length = 0;
    abuf->detached = TRUE;

    list_for_each(el, &abuf->array_list) {
        JSTypedArray *ta;
        JSObject *p;

        ta = list_entry(el, JSTypedArray, link);
        p = ta->obj;
        /* Note: the typed array length and offset fields are not modified */
        if (p->class_id != JS_CLASS_DATAVIEW) {
            p->u.array.count = 0;
            p->u.array.u.ptr = NULL;
        }
    }
}